

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ParquetWriteBind
          (duckdb *this,ClientContext *context,CopyFunctionBindInput *input,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types)

{
  vector<duckdb::Value,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar1;
  int iVar2;
  ParquetWriteBindData *this_02;
  pointer pPVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *__x;
  reference pvVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  const_reference pvVar9;
  idx_t iVar10;
  ulong uVar11;
  int64_t iVar12;
  long lVar13;
  BinderException *pBVar14;
  int64_t params_1;
  NotImplementedException *this_03;
  ParquetVersion PVar15;
  bool bVar16;
  type tVar17;
  size_type __n;
  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
  *this_04;
  long *plVar18;
  size_type __n_00;
  string roption;
  case_insensitive_map_t<LogicalType> name_to_type_map;
  vector<duckdb::Value,_true> values;
  string loption;
  undefined1 local_178 [32];
  float local_158;
  size_type local_150;
  undefined1 auStack_148 [40];
  undefined1 local_120 [32];
  float local_100;
  __node_base_ptr local_f8;
  __node_base_ptr p_Stack_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_e0;
  ulong local_d8;
  ClientContext *local_d0;
  ulong local_c8;
  string local_c0;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  double local_80;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e0 = &sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  local_d0 = context;
  this_02 = (ParquetWriteBindData *)operator_new(0xd0);
  memset(this_02,0,0xd0);
  ParquetWriteBindData::ParquetWriteBindData(this_02);
  plVar18 = *(long **)(*(long *)input + 0xe0);
  auStack_148._32_8_ = this_02;
  if (plVar18 != (long *)0x0) {
    local_c8 = 0;
    local_d8 = 0;
    auStack_148._28_4_ = 0;
    local_e8 = &names->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    local_78._M_head_impl = (FunctionData *)this;
    do {
      this_04 = (unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                 *)(auStack_148 + 0x20);
      duckdb::StringUtil::Lower((string *)&local_a0);
      if (plVar18[6] - plVar18[5] != 0x40) {
        pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
        local_178._0_8_ = local_178 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"%s requires exactly one argument","");
        duckdb::StringUtil::Upper((string *)&local_50);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar14,(string *)local_178,&local_50);
        __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (vector<duckdb::Value,_true> *)(plVar18 + 5);
      iVar2 = std::__cxx11::string::compare((char *)&local_a0);
      if (iVar2 == 0) {
LAB_0027d08d:
        vector<duckdb::Value,_true>::operator[](this_00,0);
        uVar11 = duckdb::Value::GetValue<unsigned_long>();
        pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                 ::operator->(this_04);
        pPVar3->row_group_size = uVar11;
        if ((auStack_148._28_4_ & 1) == 0) {
          pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                   ::operator->(this_04);
          pPVar3->dictionary_size_limit = pPVar3->row_group_size / 0x14;
          auStack_148._28_4_ = 0;
        }
        else {
LAB_0027d0b5:
          auStack_148._28_4_ = (undefined4)CONCAT71((int7)((ulong)pPVar3 >> 8),1);
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_a0);
        if (iVar2 == 0) goto LAB_0027d08d;
        iVar2 = std::__cxx11::string::compare((char *)&local_a0);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar2 == 0) {
            vector<duckdb::Value,_true>::operator[](this_00,0);
            uVar11 = duckdb::Value::GetValue<unsigned_long>();
            optional_idx::optional_idx((optional_idx *)local_178,uVar11);
            pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                     ::operator->(this_04);
            (pPVar3->row_groups_per_file).index = local_178._0_8_;
            goto LAB_0027d611;
          }
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar2 == 0) {
LAB_0027d154:
            vector<duckdb::Value,_true>::operator[](this_00,0);
            duckdb::Value::ToString_abi_cxx11_();
            duckdb::StringUtil::Lower((string *)local_178);
            if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
              operator_delete((void *)local_120._0_8_);
            }
            iVar2 = std::__cxx11::string::compare(local_178);
            if (iVar2 == 0) {
              pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                       ::operator->(this_04);
              tVar17 = UNCOMPRESSED;
            }
            else {
              iVar2 = std::__cxx11::string::compare(local_178);
              if (iVar2 == 0) {
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                tVar17 = SNAPPY;
              }
              else {
                iVar2 = std::__cxx11::string::compare(local_178);
                if (iVar2 == 0) {
                  pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                           ::operator->(this_04);
                  tVar17 = GZIP;
                }
                else {
                  iVar2 = std::__cxx11::string::compare(local_178);
                  if (iVar2 == 0) {
                    pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             ::operator->(this_04);
                    tVar17 = ZSTD;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare(local_178);
                    if (iVar2 == 0) {
                      pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               ::operator->(this_04);
                      tVar17 = BROTLI;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare(local_178);
                      if (iVar2 != 0) {
                        iVar2 = std::__cxx11::string::compare(local_178);
                        if (iVar2 != 0) {
                          pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                          local_120._0_8_ = local_120 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_120,
                                     "Expected %s argument to be either [uncompressed, brotli, gzip, snappy, or zstd]"
                                     ,"");
                          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_70,local_a0,local_a0 + local_98);
                          BinderException::BinderException<std::__cxx11::string>
                                    (pBVar14,(string *)local_120,&local_70);
                          __cxa_throw(pBVar14,&BinderException::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                      pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               ::operator->(this_04);
                      tVar17 = LZ4_RAW;
                    }
                  }
                }
              }
            }
            pPVar3->codec = tVar17;
LAB_0027d5fe:
            if ((element_type *)local_178._0_8_ != (element_type *)(local_178 + 0x10)) {
              operator_delete((void *)local_178._0_8_);
            }
            goto LAB_0027d611;
          }
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar2 == 0) goto LAB_0027d154;
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar2 == 0) {
            pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
            if (*pvVar9 == (value_type)0x19) {
              pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
              duckdb::StringValue::Get_abi_cxx11_(pvVar9);
              duckdb::StringUtil::Lower((string *)local_178);
              iVar2 = std::__cxx11::string::compare(local_178);
              if ((element_type *)local_178._0_8_ != (element_type *)(local_178 + 0x10)) {
                operator_delete((void *)local_178._0_8_);
              }
              if (iVar2 == 0) {
                local_178._0_8_ = (element_type *)0x0;
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                GenerateFieldIDs(&pPVar3->field_ids,(idx_t *)local_178,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)local_e8,(vector<duckdb::LogicalType,_true> *)local_e0);
                goto LAB_0027d611;
              }
            }
            local_178._0_8_ = auStack_148;
            local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
            local_178._16_8_ = 0;
            local_178._24_8_ = 0;
            local_158 = 1.0;
            local_150 = 0;
            auStack_148._0_8_ = (_Hash_node_base *)0x0;
            local_120._0_8_ = &p_Stack_f0;
            local_120._8_8_ = (_Hash_node_base *)0x1;
            local_120._16_8_ = (_Hash_node_base *)0x0;
            local_120._24_8_ = 0;
            local_100 = 1.0;
            local_f8 = (__node_base_ptr)0x0;
            p_Stack_f0 = (__node_base_ptr)0x0;
            if ((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&(local_e8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl)->_M_impl).super__Vector_impl_data._M_finish !=
                (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&(local_e8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl)->_M_impl).super__Vector_impl_data._M_start) {
              __n_00 = 0;
              do {
                pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                       *)local_e8,__n_00);
                iVar2 = std::__cxx11::string::compare((char *)pvVar5);
                if (iVar2 == 0) {
                  pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c0,
                             "Cannot have a column named \"%s\" when writing FIELD_IDS","");
                  BinderException::BinderException<char_const*>
                            (pBVar14,&local_c0,"__duckdb_field_id");
                  __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                       *)local_e8,__n_00);
                pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                                   ((vector<duckdb::LogicalType,_true> *)local_e0,__n_00);
                std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::__cxx11::string_const&,duckdb::LogicalType_const&>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)local_120,pvVar5,pvVar6);
                __n_00 = __n_00 + 1;
              } while (__n_00 < (ulong)((long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&(local_e8->
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl)->_M_impl).super__Vector_impl_data.
                                              _M_finish -
                                        (long)(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)&(local_e8->
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl)->_M_impl).super__Vector_impl_data.
                                              _M_start >> 5));
            }
            pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
            pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                     ::operator->(this_04);
            GetFieldIDs(pvVar9,&pPVar3->field_ids,
                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_178,(case_insensitive_map_t<LogicalType> *)local_120);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_120);
            std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_178);
            goto LAB_0027d611;
          }
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar2 == 0) {
            pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
            if (*pvVar9 != (value_type)0x64) {
              pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
              local_178._0_8_ = local_178 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_178,"Expected kv_metadata argument to be a STRUCT","");
              duckdb::BinderException::BinderException(pBVar14,(string *)local_178);
              __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
            }
            __x = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                  duckdb::StructValue::GetChildren(pvVar9);
            std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c0,__x);
            if ((pointer)local_c0._M_string_length != local_c0._M_dataplus._M_p) {
              __n = 0;
              do {
                pvVar7 = vector<duckdb::Value,_true>::operator[]
                                   ((vector<duckdb::Value,_true> *)&local_c0,__n);
                plVar8 = (long *)duckdb::StructType::GetChildName_abi_cxx11_
                                           ((LogicalType *)pvVar9,__n);
                local_178._0_8_ = local_178 + 0x10;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_178,*plVar8,plVar8[1] + *plVar8);
                if (*pvVar7 == (value_type)0x1a) {
                  pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                           ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                         *)(auStack_148 + 0x20));
                  __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             duckdb::StringValue::Get_abi_cxx11_(pvVar7);
                  std::
                  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  ::emplace_back<std::__cxx11::string&,std::__cxx11::string_const&>
                            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                              *)&pPVar3->kv_metadata,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_178,__args_1);
                }
                else {
                  pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                           ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                         *)(auStack_148 + 0x20));
                  duckdb::Value::ToString_abi_cxx11_();
                  std::
                  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  ::emplace_back<std::__cxx11::string&,std::__cxx11::string>
                            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                              *)&pPVar3->kv_metadata,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_178,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_120);
                  if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
                    operator_delete((void *)local_120._0_8_);
                  }
                }
                if ((element_type *)local_178._0_8_ != (element_type *)(local_178 + 0x10)) {
                  operator_delete((void *)local_178._0_8_);
                }
                __n = __n + 1;
              } while (__n < (ulong)((long)(local_c0._M_string_length -
                                           (long)local_c0._M_dataplus._M_p) >> 6));
            }
            std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c0);
            goto LAB_0027d611;
          }
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar2 == 0) {
            pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
            ParquetEncryptionConfig::Create((ParquetEncryptionConfig *)local_178,local_d0,pvVar9);
            pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                     ::operator->(this_04);
            uVar1 = local_178._8_8_;
            uVar4 = local_178._0_8_;
            local_178._0_8_ = (element_type *)0x0;
            local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_01 = (pPVar3->encryption_config).internal.
                      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            (pPVar3->encryption_config).internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)uVar4;
            (pPVar3->encryption_config).internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
              }
            }
            goto LAB_0027d611;
          }
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar2 == 0) goto LAB_0027d611;
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_a0);
            if (iVar2 == 0) {
              vector<duckdb::Value,_true>::operator[](this_00,0);
              uVar11 = duckdb::Value::GetValue<unsigned_long>();
              if (uVar11 - 0x40000001 < 0xffffffffc0000000) {
                pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                local_178._0_8_ = local_178 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_178,
                           "string_dictionary_page_size_limit cannot be 0 and must be less than or equal to %llu"
                           ,"");
                BinderException::BinderException<unsigned_long>
                          (pBVar14,(string *)local_178,0x40000000);
                __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
              }
              pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                       ::operator->(this_04);
              pPVar3->string_dictionary_page_size_limit = uVar11;
              goto LAB_0027d611;
            }
            iVar2 = std::__cxx11::string::compare((char *)&local_a0);
            if (iVar2 == 0) {
              vector<duckdb::Value,_true>::operator[](this_00,0);
              local_80 = duckdb::Value::GetValue<double>();
              if (local_80 <= 0.0) {
                pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                local_178._0_8_ = local_178 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_178,
                           "bloom_filter_false_positive_ratio must be greater than 0","");
                duckdb::BinderException::BinderException(pBVar14,(string *)local_178);
                __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
              }
              pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                       ::operator->(this_04);
              pPVar3->bloom_filter_false_positive_ratio = local_80;
              goto LAB_0027d611;
            }
            iVar2 = std::__cxx11::string::compare((char *)&local_a0);
            if (iVar2 == 0) {
              vector<duckdb::Value,_true>::operator[](this_00,0);
              duckdb::Value::GetValue<std::__cxx11::string>();
              duckdb::StringUtil::Lower((string *)local_178);
              if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
                operator_delete((void *)local_120._0_8_);
              }
              iVar2 = std::__cxx11::string::compare(local_178);
              if (iVar2 == 0) {
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                bVar16 = false;
              }
              else {
                iVar2 = std::__cxx11::string::compare(local_178);
                if (iVar2 != 0) {
                  pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                  local_120._0_8_ = local_120 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_120,"Expected debug_use_openssl to be a BOOLEAN","");
                  duckdb::BinderException::BinderException(pBVar14,(string *)local_120);
                  __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                bVar16 = true;
              }
              pPVar3->debug_use_openssl = bVar16;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_a0);
              if (iVar2 == 0) {
                vector<duckdb::Value,_true>::operator[](this_00,0);
                lVar13 = duckdb::Value::GetValue<long>();
                iVar12 = ZStdFileSystem::MinimumCompressionLevel();
                if (lVar13 < iVar12) {
LAB_0027dc3b:
                  pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                  local_178._0_8_ = local_178 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_178,"Compression level must be between %lld and %lld",
                             "");
                  iVar12 = ZStdFileSystem::MinimumCompressionLevel();
                  params_1 = ZStdFileSystem::MaximumCompressionLevel();
                  BinderException::BinderException<long,long>
                            (pBVar14,(string *)local_178,iVar12,params_1);
                  __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                iVar12 = ZStdFileSystem::MaximumCompressionLevel();
                if (iVar12 < lVar13) goto LAB_0027dc3b;
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                pPVar3->compression_level = lVar13;
                local_d8 = CONCAT71((int7)((ulong)pPVar3 >> 8),1);
                goto LAB_0027d611;
              }
              iVar2 = std::__cxx11::string::compare((char *)&local_a0);
              if (iVar2 != 0) {
                this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                local_178._0_8_ = local_178 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_178,"Unrecognized option for PARQUET: %s","");
                NotImplementedException::NotImplementedException<char_const*>
                          (this_03,(string *)local_178,(char *)plVar18[1]);
                __cxa_throw(this_03,&NotImplementedException::typeinfo,
                            std::runtime_error::~runtime_error);
              }
              vector<duckdb::Value,_true>::operator[](this_00,0);
              duckdb::Value::ToString_abi_cxx11_();
              duckdb::StringUtil::Upper((string *)local_178);
              if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
                operator_delete((void *)local_120._0_8_);
              }
              iVar2 = std::__cxx11::string::compare(local_178);
              if (iVar2 == 0) {
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                PVar15 = V1;
              }
              else {
                iVar2 = std::__cxx11::string::compare(local_178);
                if (iVar2 != 0) {
                  pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                  local_120._0_8_ = local_120 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_120,"Expected parquet_version \'V1\' or \'V2\'","");
                  duckdb::BinderException::BinderException(pBVar14,(string *)local_120);
                  __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->(this_04);
                PVar15 = V2;
              }
              pPVar3->parquet_version = PVar15;
            }
            goto LAB_0027d5fe;
          }
          vector<duckdb::Value,_true>::operator[](this_00,0);
          iVar10 = duckdb::Value::GetValue<long>();
          if ((long)iVar10 < 0) {
            pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
            local_178._0_8_ = local_178 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_178,
                       "dictionary_size_limit must be greater than 0 or 0 to disable","");
            duckdb::BinderException::BinderException(pBVar14,(string *)local_178);
            __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
          }
          pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                   ::operator->(this_04);
          pPVar3->dictionary_size_limit = iVar10;
          goto LAB_0027d0b5;
        }
        pvVar9 = vector<duckdb::Value,_true>::operator[](this_00,0);
        duckdb::Value::Value((Value *)local_178,pvVar9);
        if (local_178[0] == (string)0x19) {
          duckdb::Value::ToString_abi_cxx11_();
          iVar10 = duckdb::DBConfig::ParseMemoryLimit((string *)local_120);
          pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                   ::operator->(this_04);
          pPVar3->row_group_size_bytes = iVar10;
          if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
            operator_delete((void *)local_120._0_8_);
          }
        }
        else {
          vector<duckdb::Value,_true>::operator[](this_00,0);
          uVar11 = duckdb::Value::GetValue<unsigned_long>();
          pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                   ::operator->(this_04);
          pPVar3->row_group_size_bytes = uVar11;
        }
        uVar4 = duckdb::Value::~Value((Value *)local_178);
        local_c8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
      }
LAB_0027d611:
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      this = (duckdb *)local_78._M_head_impl;
      names = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)local_e8;
      plVar18 = (long *)*plVar18;
    } while (plVar18 != (long *)0x0);
    if ((local_c8 & 1) != 0) {
      lVar13 = duckdb::DBConfig::GetConfig(local_d0);
      if (*(char *)(lVar13 + 0x2b8) == '\x01') {
        pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
        local_178._0_8_ = local_178 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,
                   "ROW_GROUP_SIZE_BYTES does not work while preserving insertion order. Use \"SET preserve_insertion_order=false;\" to disable preserving insertion order."
                   ,"");
        duckdb::BinderException::BinderException(pBVar14,(string *)local_178);
        __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if ((local_d8 & 1) != 0) {
      pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             *)(auStack_148 + 0x20));
      if (pPVar3->codec != ZSTD) {
        pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
        local_178._0_8_ = local_178 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,
                   "Compression level is only supported for the ZSTD compression codec","");
        duckdb::BinderException::BinderException(pBVar14,(string *)local_178);
        __cxa_throw(pBVar14,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         *)(auStack_148 + 0x20));
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pPVar3->sql_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,local_e0);
  pPVar3 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         *)(auStack_148 + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(pPVar3->column_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,&names->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  *(undefined8 *)this = auStack_148._32_8_;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> ParquetWriteBind(ClientContext &context, CopyFunctionBindInput &input,
                                          const vector<string> &names, const vector<LogicalType> &sql_types) {
	D_ASSERT(names.size() == sql_types.size());
	bool row_group_size_bytes_set = false;
	bool compression_level_set = false;
	bool dictionary_size_limit_set = false;
	auto bind_data = make_uniq<ParquetWriteBindData>();
	for (auto &option : input.info.options) {
		const auto loption = StringUtil::Lower(option.first);
		if (option.second.size() != 1) {
			// All parquet write options require exactly one argument
			throw BinderException("%s requires exactly one argument", StringUtil::Upper(loption));
		}
		if (loption == "row_group_size" || loption == "chunk_size") {
			bind_data->row_group_size = option.second[0].GetValue<uint64_t>();
			if (!dictionary_size_limit_set) {
				bind_data->SetToDefaultDictionarySizeLimit();
			}
		} else if (loption == "row_group_size_bytes") {
			auto roption = option.second[0];
			if (roption.GetTypeMutable().id() == LogicalTypeId::VARCHAR) {
				bind_data->row_group_size_bytes = DBConfig::ParseMemoryLimit(roption.ToString());
			} else {
				bind_data->row_group_size_bytes = option.second[0].GetValue<uint64_t>();
			}
			row_group_size_bytes_set = true;
		} else if (loption == "row_groups_per_file") {
			bind_data->row_groups_per_file = option.second[0].GetValue<uint64_t>();
		} else if (loption == "compression" || loption == "codec") {
			const auto roption = StringUtil::Lower(option.second[0].ToString());
			if (roption == "uncompressed") {
				bind_data->codec = duckdb_parquet::CompressionCodec::UNCOMPRESSED;
			} else if (roption == "snappy") {
				bind_data->codec = duckdb_parquet::CompressionCodec::SNAPPY;
			} else if (roption == "gzip") {
				bind_data->codec = duckdb_parquet::CompressionCodec::GZIP;
			} else if (roption == "zstd") {
				bind_data->codec = duckdb_parquet::CompressionCodec::ZSTD;
			} else if (roption == "brotli") {
				bind_data->codec = duckdb_parquet::CompressionCodec::BROTLI;
			} else if (roption == "lz4" || roption == "lz4_raw") {
				/* LZ4 is technically another compression scheme, but deprecated and arrow also uses them
				 * interchangeably */
				bind_data->codec = duckdb_parquet::CompressionCodec::LZ4_RAW;
			} else {
				throw BinderException("Expected %s argument to be either [uncompressed, brotli, gzip, snappy, or zstd]",
				                      loption);
			}
		} else if (loption == "field_ids") {
			if (option.second[0].type().id() == LogicalTypeId::VARCHAR &&
			    StringUtil::Lower(StringValue::Get(option.second[0])) == "auto") {
				idx_t field_id = 0;
				GenerateFieldIDs(bind_data->field_ids, field_id, names, sql_types);
			} else {
				unordered_set<uint32_t> unique_field_ids;
				case_insensitive_map_t<LogicalType> name_to_type_map;
				for (idx_t col_idx = 0; col_idx < names.size(); col_idx++) {
					if (names[col_idx] == FieldID::DUCKDB_FIELD_ID) {
						throw BinderException("Cannot have a column named \"%s\" when writing FIELD_IDS",
						                      FieldID::DUCKDB_FIELD_ID);
					}
					name_to_type_map.emplace(names[col_idx], sql_types[col_idx]);
				}
				GetFieldIDs(option.second[0], bind_data->field_ids, unique_field_ids, name_to_type_map);
			}
		} else if (loption == "kv_metadata") {
			auto &kv_struct = option.second[0];
			auto &kv_struct_type = kv_struct.type();
			if (kv_struct_type.id() != LogicalTypeId::STRUCT) {
				throw BinderException("Expected kv_metadata argument to be a STRUCT");
			}
			auto values = StructValue::GetChildren(kv_struct);
			for (idx_t i = 0; i < values.size(); i++) {
				auto &value = values[i];
				auto key = StructType::GetChildName(kv_struct_type, i);
				// If the value is a blob, write the raw blob bytes
				// otherwise, cast to string
				if (value.type().id() == LogicalTypeId::BLOB) {
					bind_data->kv_metadata.emplace_back(key, StringValue::Get(value));
				} else {
					bind_data->kv_metadata.emplace_back(key, value.ToString());
				}
			}
		} else if (loption == "encryption_config") {
			bind_data->encryption_config = ParquetEncryptionConfig::Create(context, option.second[0]);
		} else if (loption == "dictionary_compression_ratio_threshold") {
			// deprecated, ignore setting
		} else if (loption == "dictionary_size_limit") {
			auto val = option.second[0].GetValue<int64_t>();
			if (val < 0) {
				throw BinderException("dictionary_size_limit must be greater than 0 or 0 to disable");
			}
			bind_data->dictionary_size_limit = val;
			dictionary_size_limit_set = true;
		} else if (loption == "string_dictionary_page_size_limit") {
			auto val = option.second[0].GetValue<uint64_t>();
			if (val > PrimitiveColumnWriter::MAX_UNCOMPRESSED_DICT_PAGE_SIZE || val == 0) {
				throw BinderException(
				    "string_dictionary_page_size_limit cannot be 0 and must be less than or equal to %llu",
				    PrimitiveColumnWriter::MAX_UNCOMPRESSED_DICT_PAGE_SIZE);
			}
			bind_data->string_dictionary_page_size_limit = val;
		} else if (loption == "bloom_filter_false_positive_ratio") {
			auto val = option.second[0].GetValue<double>();
			if (val <= 0) {
				throw BinderException("bloom_filter_false_positive_ratio must be greater than 0");
			}
			bind_data->bloom_filter_false_positive_ratio = val;
		} else if (loption == "debug_use_openssl") {
			auto val = StringUtil::Lower(option.second[0].GetValue<std::string>());
			if (val == "false") {
				bind_data->debug_use_openssl = false;
			} else if (val == "true") {
				bind_data->debug_use_openssl = true;
			} else {
				throw BinderException("Expected debug_use_openssl to be a BOOLEAN");
			}
		} else if (loption == "compression_level") {
			const auto val = option.second[0].GetValue<int64_t>();
			if (val < ZStdFileSystem::MinimumCompressionLevel() || val > ZStdFileSystem::MaximumCompressionLevel()) {
				throw BinderException("Compression level must be between %lld and %lld",
				                      ZStdFileSystem::MinimumCompressionLevel(),
				                      ZStdFileSystem::MaximumCompressionLevel());
			}
			bind_data->compression_level = val;
			compression_level_set = true;
		} else if (loption == "parquet_version") {
			const auto roption = StringUtil::Upper(option.second[0].ToString());
			if (roption == "V1") {
				bind_data->parquet_version = ParquetVersion::V1;
			} else if (roption == "V2") {
				bind_data->parquet_version = ParquetVersion::V2;
			} else {
				throw BinderException("Expected parquet_version 'V1' or 'V2'");
			}
		} else {
			throw NotImplementedException("Unrecognized option for PARQUET: %s", option.first.c_str());
		}
	}
	if (row_group_size_bytes_set) {
		if (DBConfig::GetConfig(context).options.preserve_insertion_order) {
			throw BinderException("ROW_GROUP_SIZE_BYTES does not work while preserving insertion order. Use \"SET "
			                      "preserve_insertion_order=false;\" to disable preserving insertion order.");
		}
	}

	if (compression_level_set && bind_data->codec != CompressionCodec::ZSTD) {
		throw BinderException("Compression level is only supported for the ZSTD compression codec");
	}

	bind_data->sql_types = sql_types;
	bind_data->column_names = names;
	return std::move(bind_data);
}